

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O0

tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* createBroker(string *brokerName,
              flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
              *fields)

{
  string_view configureString;
  string_view brokerName_00;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  result_type rVar2;
  __sv_type _Var3;
  exception *exc;
  ostringstream ss1;
  uuid uuid1;
  random_generator generator;
  bool useUuid;
  CoreType ctype;
  string type;
  string start_args;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  CoreType CVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9d0;
  key_type *in_stack_fffffffffffff9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9e0;
  char *in_stack_fffffffffffff9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa00;
  allocator<char> *in_stack_fffffffffffffa08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  *in_stack_fffffffffffffa38;
  uuid *in_stack_fffffffffffffa98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffaa0;
  string_view in_stack_fffffffffffffad0;
  char *pcVar5;
  char *pcVar6;
  char *in_stack_fffffffffffffb08;
  ostringstream local_4c8 [381];
  undefined1 local_34b [17];
  undefined1 local_33a;
  allocator<char> local_339 [65];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_2f8;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_2f0;
  allocator<char> local_2e1 [65];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_2a0;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_289 [2];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_248;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_240;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  local_231 [2];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_1f0;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_1e8;
  allocator<char> local_1d9 [65];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_198;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_190;
  undefined4 local_188;
  undefined1 local_181;
  undefined8 local_160;
  __sv_type local_158;
  CoreType local_148;
  allocator<char> local_141 [33];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_120;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_118;
  allocator<char> local_109 [33];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_e8;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_e0;
  uuid local_d1 [2];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_b0;
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_a8;
  allocator<char> local_99 [33];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_78 [3];
  vec_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_true>
  local_60 [9];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  std::__cxx11::string::string(in_stack_fffffffffffff9e0);
  std::__cxx11::string::string(in_stack_fffffffffffff9e0);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::find<char[5]>(in_stack_fffffffffffffa38,(char (*) [5])in_stack_fffffffffffffa30);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         *)in_stack_fffffffffffff9d8);
  bVar1 = boost::container::operator!=(local_60,local_78);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
               (allocator<char> *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffffaa0 =
         boost::container::
         flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffff9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator(local_99);
  }
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::find<char[5]>(in_stack_fffffffffffffa38,(char (*) [5])in_stack_fffffffffffffa30);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         *)in_stack_fffffffffffff9d8);
  bVar1 = boost::container::operator!=(&local_a8,&local_b0);
  if (bVar1) {
    in_stack_fffffffffffffa98 = local_d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
               (allocator<char> *)in_stack_fffffffffffffa00);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffff9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator((allocator<char> *)local_d1);
  }
  else {
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::find<char[9]>(in_stack_fffffffffffffa38,(char (*) [9])in_stack_fffffffffffffa30);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
           *)in_stack_fffffffffffff9d8);
    bVar1 = boost::container::operator!=(&local_e0,&local_e8);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
                 (allocator<char> *)in_stack_fffffffffffffa00);
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
            *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffff9d0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
      std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
      std::allocator<char>::~allocator(local_109);
    }
    else {
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::find<char[10]>(in_stack_fffffffffffffa38,(char (*) [10])in_stack_fffffffffffffa30);
      boost::container::
      flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
      ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
             *)in_stack_fffffffffffff9d8);
      bVar1 = boost::container::operator!=(&local_118,&local_120);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
                   (allocator<char> *)in_stack_fffffffffffffa00);
        boost::container::
        flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
        ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
              *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=(in_stack_fffffffffffff9d0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
        std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
        std::allocator<char>::~allocator(local_141);
      }
    }
  }
  local_148 = DEFAULT;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x203693);
  if (!bVar1) {
    local_158 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffff9d0);
    local_148 = helics::core::coreTypeFromString(in_stack_fffffffffffffad0);
    bVar1 = helics::core::isCoreTypeAvailable(local_148);
    if (!bVar1) {
      local_160 = 0;
      std::operator+(in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0);
      local_181 = 0;
      CLI::std::
      tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      tuple<std::nullptr_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_const_char_(&)[1],_true,_true>
                ((tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff9e0,(void **)in_stack_fffffffffffff9d8,
                 in_stack_fffffffffffff9d0,
                 (bool *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                 (char (*) [1])0x203746);
      std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
      rVar2.data._8_8_ = in_stack_fffffffffffff9d0;
      rVar2.data._0_8_ = in_stack_fffffffffffff9d8;
      goto LAB_0020414c;
    }
  }
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::find<char[9]>(in_stack_fffffffffffffa38,(char (*) [9])in_stack_fffffffffffffa30);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         *)in_stack_fffffffffffff9d8);
  bVar1 = boost::container::operator!=(&local_190,&local_198);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
               (allocator<char> *)in_stack_fffffffffffffa00);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    std::operator+((char *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffff9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator(local_1d9);
  }
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::find<char[12]>(in_stack_fffffffffffffa38,(char (*) [12])in_stack_fffffffffffffa30);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         *)in_stack_fffffffffffff9d8);
  bVar1 = boost::container::operator!=(&local_1e8,&local_1f0);
  if (bVar1) {
    in_stack_fffffffffffffa38 = local_231;
    in_stack_fffffffffffffa30 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
               (allocator<char> *)in_stack_fffffffffffffa00);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    std::operator+((char *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffff9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator((allocator<char> *)local_231);
  }
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::find<char[5]>(in_stack_fffffffffffffa38,(char (*) [5])in_stack_fffffffffffffa30);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         *)in_stack_fffffffffffff9d8);
  bVar1 = boost::container::operator!=(&local_240,&local_248);
  if (bVar1) {
    in_stack_fffffffffffffa20 = local_289;
    in_stack_fffffffffffffa18 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
               (allocator<char> *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffffa10 =
         boost::container::
         flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    std::operator+((char *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffff9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator((allocator<char> *)local_289);
  }
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::find<char[5]>(in_stack_fffffffffffffa38,(char (*) [5])in_stack_fffffffffffffa30);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         *)in_stack_fffffffffffff9d8);
  bVar1 = boost::container::operator!=(&local_298,&local_2a0);
  if (bVar1) {
    in_stack_fffffffffffffa08 = local_2e1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
               (allocator<char> *)local_18);
    boost::container::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
    ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
          *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    std::operator+((char *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffff9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator(local_2e1);
    in_stack_fffffffffffffa00 = local_18;
  }
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::find<char[10]>(in_stack_fffffffffffffa38,(char (*) [10])in_stack_fffffffffffffa30);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::end((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         *)in_stack_fffffffffffff9d8);
  bVar1 = boost::container::operator!=(&local_2f0,&local_2f8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffa10,(char *)in_stack_fffffffffffffa08,
               (allocator<char> *)in_stack_fffffffffffffa00);
    in_stack_fffffffffffff9e0 =
         boost::container::
         flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
         ::at((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
               *)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
    std::operator+((char *)in_stack_fffffffffffffa18,in_stack_fffffffffffffa10);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (in_stack_fffffffffffff9d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8));
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::__cxx11::string::~string(in_stack_fffffffffffff9d0);
    std::allocator<char>::~allocator(local_339);
  }
  local_33a = 0;
  bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x203ec5);
  rVar2.data._8_8_ = in_stack_fffffffffffff9d0;
  rVar2.data._0_8_ = in_stack_fffffffffffff9d8;
  if (bVar1) {
    rVar2 = boost::uuids::random_generator_pure::operator()
                      ((random_generator_pure *)in_stack_fffffffffffff9d8);
    local_34b._0_16_ = (undefined1  [16])rVar2;
    std::__cxx11::ostringstream::ostringstream(local_4c8);
    boost::uuids::operator<<
              ((basic_ostream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffaa0,
               in_stack_fffffffffffffa98);
    std::__cxx11::ostringstream::str();
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
    std::__cxx11::string::~string(rVar2.data._8_8_);
    local_33a = 1;
    std::__cxx11::ostringstream::~ostringstream(local_4c8);
  }
  CVar4 = local_148;
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(rVar2.data._8_8_);
  pcVar5 = (char *)_Var3._M_len;
  pcVar6 = _Var3._M_str;
  _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(rVar2.data._8_8_);
  brokerName_00._M_str = in_stack_fffffffffffffb08;
  brokerName_00._M_len = (size_t)pcVar6;
  configureString._M_str = pcVar5;
  configureString._M_len = (size_t)_Var3._M_str;
  helics::BrokerFactory::create(_Var3._M_len._4_4_,brokerName_00,configureString);
  CLI::std::
  tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  tuple<std::shared_ptr<helics::Broker>,_const_char_(&)[1],_bool_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true,_true>
            ((tuple<std::shared_ptr<helics::Broker>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff9e0,rVar2.data._0_8_,rVar2.data._8_8_,
             (bool *)CONCAT44(CVar4,in_stack_fffffffffffff9c8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x204041);
  CLI::std::shared_ptr<helics::Broker>::~shared_ptr((shared_ptr<helics::Broker> *)0x204050);
LAB_0020414c:
  local_188 = 1;
  std::__cxx11::string::~string(rVar2.data._8_8_);
  std::__cxx11::string::~string(rVar2.data._8_8_);
  return in_RDI;
}

Assistant:

static std::tuple<std::shared_ptr<helics::Broker>, std::string, bool, std::string>
    createBroker(std::string& brokerName,
                 const boost::container::flat_map<std::string, std::string>& fields)
{
    std::string start_args;
    std::string type;
    if (fields.find("args") != fields.end()) {
        start_args = fields.at("args");
    }
    if (fields.find("type") != fields.end()) {
        type = fields.at("type");
    } else if (fields.find("CoreType") != fields.end()) {
        type = fields.at("CoreType");
    } else if (fields.find("core_type") != fields.end()) {
        type = fields.at("core_type");
    }
    helics::CoreType ctype{helics::CoreType::DEFAULT};
    if (!type.empty()) {
        ctype = helics::core::coreTypeFromString(type);
        if (!helics::core::isCoreTypeAvailable(ctype)) {
            // return send(bad_request(type + " is not available"));
            return {nullptr, type + " is not available", false, ""};
        }
    }
    if (fields.find("num_feds") != fields.end()) {
        start_args += " -f " + fields.at("num_feds");
    }
    if (fields.find("num_brokers") != fields.end()) {
        start_args += " --minbrokers=" + fields.at("num_brokers");
    }
    if (fields.find("port") != fields.end()) {
        start_args += " --port=" + fields.at("port");
    }
    if (fields.find("host") != fields.end()) {
        start_args += " --interface=" + fields.at("host");
    }
    if (fields.find("log_level") != fields.end()) {
        start_args += " --loglevel=" + fields.at("log_level");
    }
    bool useUuid{false};
    if (brokerName.empty()) {
        boost::uuids::random_generator generator;

        const boost::uuids::uuid uuid1 = generator();
        std::ostringstream ss1;
        ss1 << uuid1;
        brokerName = ss1.str();
        useUuid = true;
    }
    try {
        return {helics::BrokerFactory::create(ctype, brokerName, start_args), "", useUuid, type};
    }
    catch (const std::exception& exc) {
        return {nullptr, exc.what(), false, ""};
    }
}